

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_noActualCallForUnmodifiedOutputParameter_TestShell::
~TEST_MockParameterTest_noActualCallForUnmodifiedOutputParameter_TestShell
          (TEST_MockParameterTest_noActualCallForUnmodifiedOutputParameter_TestShell *this)

{
  TEST_MockParameterTest_noActualCallForUnmodifiedOutputParameter_TestShell *this_local;
  
  ~TEST_MockParameterTest_noActualCallForUnmodifiedOutputParameter_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockParameterTest, noActualCallForUnmodifiedOutputParameter)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    mock().expectOneCall("foo").withUnmodifiedOutputParameter("output");

    expectations.addFunction("foo")->withUnmodifiedOutputParameter("output");
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}